

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_getFrameHeader_advanced
                 (ZSTD_frameHeader *zfhPtr,void *src,size_t srcSize,ZSTD_format_e format)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  
  lVar1 = (ulong)(format != ZSTD_f_zstd1_magicless) * 4;
  uVar8 = lVar1 + 1;
  zfhPtr->blockSizeMax = 0;
  zfhPtr->frameType = ZSTD_frame;
  zfhPtr->headerSize = 0;
  zfhPtr->dictID = 0;
  zfhPtr->frameContentSize = 0;
  zfhPtr->windowSize = 0;
  *(undefined8 *)&zfhPtr->checksumFlag = 0;
  uVar4 = uVar8;
  if (uVar8 <= srcSize) {
    if (src == (void *)0x0) {
      uVar4 = 0xffffffffffffffff;
    }
    else if ((format == ZSTD_f_zstd1_magicless) || (*src == 0xfd2fb528)) {
      uVar4 = ZSTD_frameHeaderSize_internal(src,srcSize,format);
      if (uVar4 <= srcSize) {
        zfhPtr->headerSize = (uint)uVar4;
        bVar2 = *(byte *)((long)src + lVar1);
        uVar4 = 0xfffffffffffffff2;
        if ((bVar2 & 8) == 0) {
          if ((bVar2 & 0x20) == 0) {
            bVar3 = *(byte *)((long)src + uVar8);
            if (0xaf < bVar3) {
              return 0xfffffffffffffff0;
            }
            uVar8 = 1L << (bVar3 >> 3) + 10;
            lVar6 = (ulong)(bVar3 & 7) * (uVar8 >> 3) + uVar8;
            uVar8 = lVar1 + 2;
          }
          else {
            lVar6 = 0;
          }
          uVar7 = (uint)(bVar2 >> 6);
          switch(bVar2 & 3) {
          case 0:
            sVar5 = (*(code *)(&DAT_004cd630 + *(int *)(&DAT_004cd630 + (ulong)uVar7 * 4)))
                              (&DAT_004cd630 + *(int *)(&DAT_004cd630 + (ulong)uVar7 * 4));
            return sVar5;
          case 1:
            sVar5 = (*(code *)(&DAT_004cd630 + *(int *)(&DAT_004cd630 + (ulong)uVar7 * 4)))
                              (&DAT_004cd630 + *(int *)(&DAT_004cd630 + (ulong)uVar7 * 4),lVar6,
                               bVar2,*(undefined1 *)((long)src + uVar8));
            return sVar5;
          case 2:
            sVar5 = (*(code *)(&DAT_004cd630 + *(int *)(&DAT_004cd630 + (ulong)uVar7 * 4)))
                              (&DAT_004cd630 + *(int *)(&DAT_004cd630 + (ulong)uVar7 * 4),lVar6,
                               bVar2,*(undefined2 *)((long)src + uVar8));
            return sVar5;
          case 3:
            sVar5 = (*(code *)(&DAT_004cd630 + *(int *)(&DAT_004cd630 + (ulong)uVar7 * 4)))
                              (&DAT_004cd630 + *(int *)(&DAT_004cd630 + (ulong)uVar7 * 4),lVar6,
                               bVar2,*(undefined4 *)((long)src + uVar8));
            return sVar5;
          }
        }
      }
    }
    else {
      uVar4 = 0xfffffffffffffff6;
      if (((*src & 0xfffffff0) == 0x184d2a50) && (uVar4 = 8, 7 < srcSize)) {
        zfhPtr->blockSizeMax = 0;
        zfhPtr->frameType = ZSTD_frame;
        zfhPtr->headerSize = 0;
        zfhPtr->dictID = 0;
        zfhPtr->frameContentSize = 0;
        zfhPtr->windowSize = 0;
        *(undefined8 *)&zfhPtr->checksumFlag = 0;
        zfhPtr->frameContentSize = (ulong)*(uint *)((long)src + 4);
        zfhPtr->frameType = ZSTD_skippableFrame;
        uVar4 = 0;
      }
    }
  }
  return uVar4;
}

Assistant:

size_t ZSTD_getFrameHeader_advanced(ZSTD_frameHeader* zfhPtr, const void* src, size_t srcSize, ZSTD_format_e format)
{
    const BYTE* ip = (const BYTE*)src;
    size_t const minInputSize = ZSTD_startingInputLength(format);

    memset(zfhPtr, 0, sizeof(*zfhPtr));   /* not strictly necessary, but static analyzer do not understand that zfhPtr is only going to be read only if return value is zero, since they are 2 different signals */
    if (srcSize < minInputSize) return minInputSize;
    if (src==NULL) return ERROR(GENERIC);   /* invalid parameter */

    if ( (format != ZSTD_f_zstd1_magicless)
      && (MEM_readLE32(src) != ZSTD_MAGICNUMBER) ) {
        if ((MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
            /* skippable frame */
            if (srcSize < ZSTD_SKIPPABLEHEADERSIZE)
                return ZSTD_SKIPPABLEHEADERSIZE; /* magic number + frame length */
            memset(zfhPtr, 0, sizeof(*zfhPtr));
            zfhPtr->frameContentSize = MEM_readLE32((const char *)src + ZSTD_FRAMEIDSIZE);
            zfhPtr->frameType = ZSTD_skippableFrame;
            return 0;
        }
        return ERROR(prefix_unknown);
    }

    /* ensure there is enough `srcSize` to fully read/decode frame header */
    {   size_t const fhsize = ZSTD_frameHeaderSize_internal(src, srcSize, format);
        if (srcSize < fhsize) return fhsize;
        zfhPtr->headerSize = (U32)fhsize;
    }

    {   BYTE const fhdByte = ip[minInputSize-1];
        size_t pos = minInputSize;
        U32 const dictIDSizeCode = fhdByte&3;
        U32 const checksumFlag = (fhdByte>>2)&1;
        U32 const singleSegment = (fhdByte>>5)&1;
        U32 const fcsID = fhdByte>>6;
        U64 windowSize = 0;
        U32 dictID = 0;
        U64 frameContentSize = ZSTD_CONTENTSIZE_UNKNOWN;
        if ((fhdByte & 0x08) != 0)
            return ERROR(frameParameter_unsupported); /* reserved bits, must be zero */

        if (!singleSegment) {
            BYTE const wlByte = ip[pos++];
            U32 const windowLog = (wlByte >> 3) + ZSTD_WINDOWLOG_ABSOLUTEMIN;
            if (windowLog > ZSTD_WINDOWLOG_MAX)
                return ERROR(frameParameter_windowTooLarge);
            windowSize = (1ULL << windowLog);
            windowSize += (windowSize >> 3) * (wlByte&7);
        }
        switch(dictIDSizeCode)
        {
            default: assert(0);  /* impossible */
            case 0 : break;
            case 1 : dictID = ip[pos]; pos++; break;
            case 2 : dictID = MEM_readLE16(ip+pos); pos+=2; break;
            case 3 : dictID = MEM_readLE32(ip+pos); pos+=4; break;
        }
        switch(fcsID)
        {
            default: assert(0);  /* impossible */
            case 0 : if (singleSegment) frameContentSize = ip[pos]; break;
            case 1 : frameContentSize = MEM_readLE16(ip+pos)+256; break;
            case 2 : frameContentSize = MEM_readLE32(ip+pos); break;
            case 3 : frameContentSize = MEM_readLE64(ip+pos); break;
        }
        if (singleSegment) windowSize = frameContentSize;

        zfhPtr->frameType = ZSTD_frame;
        zfhPtr->frameContentSize = frameContentSize;
        zfhPtr->windowSize = windowSize;
        zfhPtr->blockSizeMax = (unsigned) MIN(windowSize, ZSTD_BLOCKSIZE_MAX);
        zfhPtr->dictID = dictID;
        zfhPtr->checksumFlag = checksumFlag;
    }
    return 0;
}